

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

void ra_to_uint32_array(roaring_array_t *ra,uint32_t *ans)

{
  int *in_RDI;
  int num_added;
  int32_t i;
  size_t ctr;
  uint32_t in_stack_ffffffffffffffd8;
  uint8_t in_stack_ffffffffffffffdf;
  int in_stack_ffffffffffffffe0;
  int iVar1;
  uint32_t *output;
  
  output = (uint32_t *)0x0;
  for (iVar1 = 0; iVar1 < *in_RDI; iVar1 = iVar1 + 1) {
    in_stack_ffffffffffffffe0 =
         container_to_uint32_array
                   (output,(container_t *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8);
    output = (uint32_t *)((long)in_stack_ffffffffffffffe0 + (long)output);
  }
  return;
}

Assistant:

void ra_to_uint32_array(const roaring_array_t *ra, uint32_t *ans) {
    size_t ctr = 0;
    for (int32_t i = 0; i < ra->size; ++i) {
        int num_added = container_to_uint32_array(
            ans + ctr, ra->containers[i], ra->typecodes[i],
            ((uint32_t)ra->keys[i]) << 16);
        ctr += num_added;
    }
}